

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GLMClassifier::GLMClassifier(GLMClassifier *this)

{
  GLMClassifier *pGVar1;
  GLMClassifier *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GLMClassifier_00624e70;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
  RepeatedPtrField(&this->weights_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->offset_);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  pGVar1 = internal_default_instance();
  if (this != pGVar1) {
    protobuf_GLMClassifier_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

GLMClassifier::GLMClassifier()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_GLMClassifier_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.GLMClassifier)
}